

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::DwaCompressor::initializeBuffers(DwaCompressor *this,size_t *outBufferSize)

{
  CompressorScheme CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  Zip *pZVar8;
  char *pcVar9;
  pointer pCVar10;
  NoImplExc *this_00;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int i;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  int local_a4;
  int local_98 [4];
  undefined8 local_88;
  int local_7c;
  float local_78;
  float local_74;
  size_t *local_70;
  long local_68;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  local_60;
  
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)&this->_channels);
  classifyChannels(this,(ChannelList *)&local_60,&this->_channelData,&this->_cscSets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree(&local_60);
  iVar2 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
  fVar17 = ceilf((float)iVar2 * 0.125);
  fVar18 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  iVar2 = (int)fVar18 * (int)fVar17 * 0x7e;
  iVar3 = (*(this->super_Compressor)._vptr_Compressor[2])();
  local_74 = ceilf((float)iVar3 * 0.125);
  local_78 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  pCVar10 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = outBufferSize;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar10) {
    local_a4 = 0x58;
    iVar3 = 0;
    lVar14 = 0;
    uVar11 = 0;
  }
  else {
    local_88 = CONCAT44(local_88._4_4_,(int)fVar18 * (int)fVar17 * 0xfc + 0x10000);
    local_68 = (long)iVar2;
    local_a4 = 0;
    iVar5 = 0;
    iVar12 = 0;
    iVar3 = 0;
    uVar11 = 0;
    uVar15 = 1;
    local_7c = iVar2;
    do {
      CVar1 = pCVar10[uVar11].compression;
      if (CVar1 == UNKNOWN) {
        iVar6 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar2 = this->_max[0];
        iVar13 = this->_min[0];
        iVar4 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].type);
        iVar12 = iVar12 + iVar4 * ((iVar2 - iVar13) + 1) * iVar6;
      }
      else if (CVar1 == RLE) {
        iVar6 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar2 = this->_max[0];
        iVar13 = this->_min[0];
        iVar4 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].type);
        iVar5 = iVar5 + iVar4 * ((iVar2 - iVar13) + 1) * iVar6 * 2;
      }
      else {
        if (CVar1 != LOSSY_DCT) goto LAB_0040fb60;
        iVar2 = compressBound(local_68);
        if (iVar2 < (int)local_88) {
          iVar2 = (int)local_88;
        }
        local_a4 = iVar2 + local_a4;
        iVar3 = iVar3 + 1;
      }
      pCVar10 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar10 >> 3) *
               -0x79435e50d79435e5;
      bVar16 = uVar15 <= uVar11;
      lVar14 = uVar11 - uVar15;
      uVar11 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar16 && lVar14 != 0);
    uVar11 = (ulong)iVar5;
    lVar14 = (long)iVar12;
    local_a4 = local_a4 + 0x58;
    iVar2 = local_7c;
  }
  iVar5 = (int)local_74;
  iVar13 = (int)local_78;
  local_88 = compressBound();
  iVar12 = compressBound(lVar14);
  uVar15 = (ulong)(iVar13 * iVar5 * 2 * iVar3);
  if (this->_zip == (Zip *)0x0) {
    pZVar8 = (Zip *)operator_new(0x10);
    Zip::Zip(pZVar8,uVar15);
  }
  else {
    sVar7 = Zip::maxRawSize(this->_zip);
    if (uVar15 <= sVar7) goto LAB_0040f94c;
    pZVar8 = this->_zip;
    if (pZVar8 != (Zip *)0x0) {
      Zip::~Zip(pZVar8);
      operator_delete(pZVar8,0x10);
    }
    pZVar8 = (Zip *)operator_new(0x10);
    Zip::Zip(pZVar8,uVar15);
  }
  this->_zip = pZVar8;
LAB_0040f94c:
  sVar7 = Zip::maxCompressedSize(this->_zip);
  *local_70 = (long)(local_a4 + (int)local_88 + iVar12 + (int)sVar7);
  if (this->_packedAcBufferSize < (ulong)(long)(iVar3 * iVar2)) {
    this->_packedAcBufferSize = (long)(iVar3 * iVar2);
    if (this->_packedAcBuffer != (char *)0x0) {
      operator_delete__(this->_packedAcBuffer);
    }
    pcVar9 = (char *)operator_new__(this->_packedAcBufferSize);
    this->_packedAcBuffer = pcVar9;
  }
  if (this->_packedDcBufferSize < uVar15) {
    this->_packedDcBufferSize = uVar15;
    if (this->_packedDcBuffer != (char *)0x0) {
      operator_delete__(this->_packedDcBuffer);
    }
    pcVar9 = (char *)operator_new__(this->_packedDcBufferSize);
    this->_packedDcBuffer = pcVar9;
  }
  if (this->_rleBufferSize < uVar11) {
    this->_rleBufferSize = uVar11;
    if (this->_rleBuffer != (char *)0x0) {
      operator_delete__(this->_rleBuffer);
    }
    pcVar9 = (char *)operator_new__(uVar11);
    this->_rleBuffer = pcVar9;
  }
  local_98[2] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  pCVar10 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar10) {
    iVar2 = 0;
  }
  else {
    iVar3 = 0;
    iVar2 = 0;
    uVar11 = 0;
    uVar15 = 1;
    do {
      CVar1 = pCVar10[uVar11].compression;
      if (CVar1 == UNKNOWN) {
        iVar13 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar5 = this->_max[0];
        iVar12 = this->_min[0];
        iVar6 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].type);
        iVar2 = iVar2 + iVar6 * ((iVar5 - iVar12) + 1) * iVar13;
      }
      else if (CVar1 != LOSSY_DCT) {
        if (CVar1 != RLE) {
          local_98[0] = iVar2;
          local_98[2] = iVar3;
LAB_0040fb60:
          this_00 = (NoImplExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::NoImplExc::NoImplExc(this_00,"Unhandled compression scheme case");
          __cxa_throw(this_00,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
        }
        iVar13 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar5 = this->_max[0];
        iVar12 = this->_min[0];
        iVar6 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].type);
        iVar3 = iVar3 + iVar6 * ((iVar5 - iVar12) + 1) * iVar13;
      }
      pCVar10 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar10 >> 3) *
               -0x79435e50d79435e5;
      bVar16 = uVar15 <= uVar11;
      lVar14 = uVar11 - uVar15;
      uVar11 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar16 && lVar14 != 0);
    local_98[2] = iVar3;
  }
  local_98[0] = iVar2;
  if (0 < iVar2) {
    local_98[0] = compressBound(iVar2);
  }
  lVar14 = 0;
  do {
    uVar11 = (ulong)local_98[lVar14];
    if (this->_planarUncBufferSize[lVar14] < uVar11) {
      this->_planarUncBufferSize[lVar14] = uVar11;
      if (this->_planarUncBuffer[lVar14] != (char *)0x0) {
        operator_delete__(this->_planarUncBuffer[lVar14]);
      }
      pcVar9 = (char *)operator_new__(uVar11);
      this->_planarUncBuffer[lVar14] = pcVar9;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  return;
}

Assistant:

void
DwaCompressor::initializeBuffers (size_t &outBufferSize)
{
    classifyChannels (_channels, _channelData, _cscSets);

    //
    // _outBuffer needs to be big enough to hold all our 
    // compressed data - which could vary depending on what sort
    // of channels we have. 
    //

    int maxOutBufferSize  = 0;
    int numLossyDctChans  = 0;
    int unknownBufferSize = 0;
    int rleBufferSize     = 0;

    int maxLossyDctAcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            63 * sizeof (unsigned short);

    int maxLossyDctDcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            sizeof (unsigned short);

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:

            //
            // This is the size of the number of packed
            // components, plus the requirements for
            // maximum Huffman encoding size (for STATIC_HUFFMAN)
            // or for zlib compression (for DEFLATE)
            //

            maxOutBufferSize += std::max(
                            (int)(2 * maxLossyDctAcSize + 65536),
                            (int)compressBound (maxLossyDctAcSize) );
            numLossyDctChans++;
            break;

          case RLE:
            {
                //
                // RLE, if gone horribly wrong, could double the size
                // of the source data.
                //

                int rleAmount = 2 * numScanLines() * (_max[0] - _min[0] + 1) *
                                OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);

                rleBufferSize += rleAmount;
            }
            break;


          case UNKNOWN:

            unknownBufferSize += numScanLines() * (_max[0] - _min[0] + 1) *
                                 OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // Also, since the results of the RLE are packed into 
    // the output buffer, we need the extra room there. But
    // we're going to zlib compress() the data we pack, 
    // which could take slightly more space
    //

    maxOutBufferSize += (int)compressBound ((uLongf)rleBufferSize);
    
    //
    // And the same goes for the UNKNOWN data
    //

    maxOutBufferSize += (int)compressBound ((uLongf)unknownBufferSize);

    //
    // Allocate a zip/deflate compressor big enought to hold the DC data
    // and include it's compressed results in the size requirements
    // for our output buffer
    //

    if (_zip == 0) 
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    else if (_zip->maxRawSize() < static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans))
    {
        delete _zip;
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    }


    maxOutBufferSize += _zip->maxCompressedSize();

    //
    // We also need to reserve space at the head of the buffer to 
    // write out the size of our various packed and compressed data.
    //

    maxOutBufferSize += NUM_SIZES_SINGLE * sizeof (Int64); 
                    

    //
    // Later, we're going to hijack outBuffer for the result of
    // both encoding and decoding. So it needs to be big enough
    // to hold either a buffers' worth of uncompressed or
    // compressed data
    //
    // For encoding, we'll need _outBuffer to hold maxOutBufferSize bytes,
    // but for decoding, we only need it to be maxScanLineSize*numScanLines.
    // Cache the max size for now, and alloc the buffer when we either
    // encode or decode.
    //

    outBufferSize = maxOutBufferSize;


    //
    // _packedAcBuffer holds the quantized DCT coefficients prior
    // to Huffman encoding
    //

    if (static_cast<size_t>(maxLossyDctAcSize * numLossyDctChans) > _packedAcBufferSize)
    {
        _packedAcBufferSize = maxLossyDctAcSize * numLossyDctChans;
        if (_packedAcBuffer != 0) 
            delete[] _packedAcBuffer;
        _packedAcBuffer = new char[_packedAcBufferSize];
    }

    //
    // _packedDcBuffer holds one quantized DCT coef per 8x8 block
    //

    if (static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans) > _packedDcBufferSize)
    {
        _packedDcBufferSize = maxLossyDctDcSize * numLossyDctChans;
        if (_packedDcBuffer != 0) 
            delete[] _packedDcBuffer;
        _packedDcBuffer     = new char[_packedDcBufferSize];
    }

    if (static_cast<size_t>(rleBufferSize) > _rleBufferSize) 
    {
        _rleBufferSize = rleBufferSize;
        if (_rleBuffer != 0) 
            delete[] _rleBuffer;
        _rleBuffer = new char[rleBufferSize];
    }

    // 
    // The planar uncompressed buffer will hold float data for LOSSY_DCT
    // compressed values, and whatever the native type is for other
    // channels. We're going to use this to hold data in a planar
    // format, as opposed to the native interleaved format we take
    // into compress() and give back from uncompress().
    //
    // This also makes it easier to compress the UNKNOWN and RLE data
    // all in one swoop (for each compression scheme).
    //

    int planarUncBufferSize[NUM_COMPRESSOR_SCHEMES];
    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        planarUncBufferSize[i] = 0;

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:
            break;

          case RLE:
            planarUncBufferSize[RLE] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          case UNKNOWN: 
            planarUncBufferSize[UNKNOWN] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:
            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // UNKNOWN data is going to be zlib compressed, which needs 
    // a little extra headroom
    //

    if (planarUncBufferSize[UNKNOWN] > 0)
    {
        planarUncBufferSize[UNKNOWN] = 
            compressBound ((uLongf)planarUncBufferSize[UNKNOWN]);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (static_cast<size_t>(planarUncBufferSize[i]) > _planarUncBufferSize[i]) 
        {
            _planarUncBufferSize[i] = planarUncBufferSize[i];
            if (_planarUncBuffer[i] != 0) 
                delete[] _planarUncBuffer[i];
            _planarUncBuffer[i] = new char[planarUncBufferSize[i]];
        }
    }
}